

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void xdgSurfaceHandleConfigure(void *userData,xdg_surface *surface,uint32_t serial)

{
  wl_proxy *pwVar1;
  PFN_wl_proxy_marshal_flags p_Var2;
  uint32_t uVar3;
  GLFWbool GVar4;
  int height;
  int iVar5;
  float fVar6;
  float fVar7;
  
  p_Var2 = _glfw.wl.client.proxy_marshal_flags;
  uVar3 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)surface);
  (*p_Var2)((wl_proxy *)surface,4,(wl_interface *)0x0,uVar3,0,(ulong)serial);
  iVar5 = *(int *)((long)userData + 0x3b0);
  if ((((*(int *)((long)userData + 0x370) != iVar5) &&
       (*(int *)((long)userData + 0x370) = iVar5, p_Var2 = _glfw.wl.client.proxy_marshal_flags,
       iVar5 == 0)) && (*(long *)((long)userData + 0x50) != 0)) &&
     (*(int *)((long)userData + 0x10) != 0)) {
    pwVar1 = *(wl_proxy **)((long)userData + 0x3c0);
    uVar3 = (*_glfw.wl.client.proxy_get_version)(pwVar1);
    (*p_Var2)(pwVar1,0xd,(wl_interface *)0x0,uVar3,0);
  }
  iVar5 = *(int *)((long)userData + 0x3a8);
  if (*(int *)((long)userData + 0x36c) != iVar5) {
    *(int *)((long)userData + 0x36c) = iVar5;
    _glfwInputWindowMaximize((_GLFWwindow *)userData,iVar5);
  }
  *(int *)((long)userData + 0x374) = *(int *)((long)userData + 0x3b4);
  iVar5 = *(int *)((long)userData + 0x3a0);
  height = *(int *)((long)userData + 0x3a4);
  if (((*(int *)((long)userData + 0x3b4) == 0 && *(int *)((long)userData + 0x36c) == 0) &&
      (*(int *)((long)userData + 0x78) != -1)) && (*(int *)((long)userData + 0x7c) != -1)) {
    fVar7 = (float)iVar5 / (float)height;
    fVar6 = (float)*(int *)((long)userData + 0x78) / (float)*(int *)((long)userData + 0x7c);
    if (fVar6 <= fVar7) {
      if (fVar6 < fVar7) {
        iVar5 = (int)(fVar6 * (float)height);
      }
    }
    else {
      height = (int)((float)iVar5 / fVar6);
    }
  }
  GVar4 = resizeWindow((_GLFWwindow *)userData,iVar5,height);
  if (GVar4 != 0) {
    _glfwInputWindowSize
              ((_GLFWwindow *)userData,*(int *)((long)userData + 0x358),
               *(int *)((long)userData + 0x35c));
    if (*(int *)((long)userData + 0x368) != 0) {
      _glfwInputWindowDamage((_GLFWwindow *)userData);
    }
  }
  if ((*(int *)((long)userData + 0x368) == 0) &&
     ((*(long *)((long)userData + 0x3c8) == 0 || (*(int *)((long)userData + 0x3d0) != 0)))) {
    *(undefined4 *)((long)userData + 0x368) = 1;
    _glfwInputWindowDamage((_GLFWwindow *)userData);
    return;
  }
  return;
}

Assistant:

static void xdgSurfaceHandleConfigure(void* userData,
                                      struct xdg_surface* surface,
                                      uint32_t serial)
{
    _GLFWwindow* window = userData;

    xdg_surface_ack_configure(surface, serial);

    if (window->wl.activated != window->wl.pending.activated)
    {
        window->wl.activated = window->wl.pending.activated;
        if (!window->wl.activated)
        {
            if (window->monitor && window->autoIconify)
                xdg_toplevel_set_minimized(window->wl.xdg.toplevel);
        }
    }

    if (window->wl.maximized != window->wl.pending.maximized)
    {
        window->wl.maximized = window->wl.pending.maximized;
        _glfwInputWindowMaximize(window, window->wl.maximized);
    }

    window->wl.fullscreen = window->wl.pending.fullscreen;

    int width  = window->wl.pending.width;
    int height = window->wl.pending.height;

    if (!window->wl.maximized && !window->wl.fullscreen)
    {
        if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
        {
            const float aspectRatio = (float) width / (float) height;
            const float targetRatio = (float) window->numer / (float) window->denom;
            if (aspectRatio < targetRatio)
                height = width / targetRatio;
            else if (aspectRatio > targetRatio)
                width = height * targetRatio;
        }
    }

    if (resizeWindow(window, width, height))
    {
        _glfwInputWindowSize(window, window->wl.width, window->wl.height);

        if (window->wl.visible)
            _glfwInputWindowDamage(window);
    }

    if (!window->wl.visible)
    {
        // Allow the window to be mapped only if it either has no XDG
        // decorations or they have already received a configure event
        if (!window->wl.xdg.decoration || window->wl.xdg.decorationMode)
        {
            window->wl.visible = GLFW_TRUE;
            _glfwInputWindowDamage(window);
        }
    }
}